

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

size_t PAL_GetLogicalProcessorCacheSizeFromOS(void)

{
  ulong uVar1;
  undefined8 local_60;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_30;
  size_t cacheSize;
  
  sysconf(0xbc);
  local_30 = sysconf(0xbc);
  uVar1 = sysconf(0xb9);
  if (local_30 <= uVar1) {
    local_30 = sysconf(0xb9);
  }
  uVar1 = sysconf(0xbf);
  if (uVar1 < local_30) {
    local_40 = local_30;
  }
  else {
    local_40 = sysconf(0xbf);
  }
  uVar1 = sysconf(0xc2);
  if (uVar1 < local_40) {
    local_50 = local_40;
  }
  else {
    local_50 = sysconf(0xc2);
  }
  uVar1 = sysconf(0xc5);
  if (uVar1 < local_50) {
    local_60 = local_50;
  }
  else {
    local_60 = sysconf(0xc5);
  }
  return local_60;
}

Assistant:

size_t
PALAPI
PAL_GetLogicalProcessorCacheSizeFromOS()
{
    size_t cacheSize = 0;

#if HAVE_SYSCONF && defined(__LINUX__) && !defined(__ANDROID__)
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL1_DCACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL1_ICACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL2_CACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL3_CACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL4_CACHE_SIZE));
#endif

    return cacheSize;
}